

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

int16_t mpack_node_i16(mpack_node_t node)

{
  ulong uVar1;
  mpack_tree_t *pmVar2;
  mpack_node_data_t *pmVar3;
  
  pmVar2 = node.tree;
  pmVar3 = node.data;
  if (pmVar2->error == mpack_ok) {
    if (pmVar3->type == mpack_type_int) {
      uVar1 = (pmVar3->value).i;
      if ((long)(short)uVar1 == uVar1) goto LAB_00105365;
    }
    else if ((pmVar3->type == mpack_type_uint) && (uVar1 = (pmVar3->value).u, uVar1 < 0x8000))
    goto LAB_00105365;
    pmVar2->error = mpack_error_type;
    if (pmVar2->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar2->error_fn)(pmVar2,mpack_error_type);
      return 0;
    }
  }
  uVar1 = 0;
LAB_00105365:
  return (int16_t)uVar1;
}

Assistant:

MPACK_INLINE int16_t mpack_node_i16(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= INT16_MAX)
            return (int16_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= INT16_MIN && node.data->value.i <= INT16_MAX)
            return (int16_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}